

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

WhileStatement * __thiscall SQCompilation::SQParser::parseWhileStatement(SQParser *this)

{
  long lVar1;
  SQInteger SVar2;
  WhileStatement *pWVar3;
  uint uVar4;
  Expr *pEVar5;
  Statement *pSVar6;
  long lVar7;
  Chunk *pCVar8;
  bool local_29;
  
  uVar4 = this->_depth;
  if (500 < uVar4) {
    reportDiagnostic(this,0x1d);
    uVar4 = this->_depth;
  }
  this->_depth = uVar4 + 1;
  lVar1 = (this->_lex)._tokencolumn;
  SVar2 = (this->_lex)._tokenline;
  Lex(this);
  Expect(this,0x28);
  pEVar5 = Expression(this,SQE_LOOP_CONDITION);
  Expect(this,0x29);
  if ((this->_token == 0x7b) && (((this->_lex)._prevflags & 1) != 0)) {
    reportDiagnostic(this,0x69);
  }
  pSVar6 = IfLikeBlock(this,&local_29);
  if ((this->_lex)._prevtoken != 10) {
    lVar7 = this->_token;
    if (lVar7 < 0x7d) {
      if ((lVar7 == 0) || (lVar7 == 0x3b)) goto LAB_00160074;
    }
    else if ((lVar7 == 0x7d) || (lVar7 == 0x14c)) goto LAB_00160074;
    reportDiagnostic(this,0x38,"while loop body");
  }
  lVar7 = this->_token;
LAB_00160074:
  if ((((lVar7 != 0) && (lVar7 != 0x7d)) &&
      ((this->_lex)._tokenline != (long)(pSVar6->super_Node)._coordinates.lineEnd)) &&
     (lVar1 < (this->_lex)._tokencolumn)) {
    reportDiagnostic(this,0x68);
  }
  pCVar8 = Arena::findChunk(this->_astArena,0x30);
  pWVar3 = (WhileStatement *)pCVar8->_ptr;
  pCVar8->_ptr = (uint8_t *)(pWVar3 + 1);
  (pWVar3->super_LoopStatement).super_Statement.super_Node._op = TO_WHILE;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.lineEnd = -1;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.columnEnd = -1;
  (pWVar3->super_LoopStatement)._body = pSVar6;
  (pWVar3->super_LoopStatement).super_Statement.super_Node.super_ArenaObj._vptr_ArenaObj =
       (_func_int **)&PTR__ArenaObj_001a2830;
  pWVar3->_cond = pEVar5;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart = (int)SVar2;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.columnStart = (int)lVar1;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.lineEnd =
       (int)(this->_lex)._currentline;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.columnEnd =
       (int)(this->_lex)._currentcolumn;
  this->_depth = this->_depth - 1;
  return pWVar3;
}

Assistant:

WhileStatement* SQParser::parseWhileStatement()
{
    NestingChecker nc(this);

    SQInteger l = line(), c = column();

    Consume(TK_WHILE);

    Expect(_SC('('));
    Expr *cond = Expression(SQE_LOOP_CONDITION);
    Expect(_SC(')'));

    bool wrapped = false;
    checkBraceIndentationStyle();
    Statement *body = IfLikeBlock(wrapped);

    if (!IsEndOfStatement()) {
      reportDiagnostic(DiagnosticsId::DI_STMT_SAME_LINE, "while loop body");
    }

    if (_token != SQUIRREL_EOB && _token != _SC('}')) {
      if (line() != body->lineEnd() && column() > c) {
        reportDiagnostic(DiagnosticsId::DI_SUSPICIOUS_FMT);
      }
    }

    return setCoordinates(newNode<WhileStatement>(cond, body), l, c);
}